

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

void Abc_ObjSortInReverseOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vOrder;
  Vec_Ptr_t *vNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkDfsReverse(pNtk);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p,local_2c);
    *(int *)((long)pvVar2 + 0x40) = local_2c;
  }
  Vec_PtrSort(vNodes,Abc_ObjCompareByNumber);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p,local_2c);
    *(undefined4 *)((long)pvVar2 + 0x40) = 0;
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_ObjSortInReverseOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pNode; 
    int i;
    vOrder = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = i;
    Vec_PtrSort( vNodes, (int (*)())Abc_ObjCompareByNumber );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = 0;
    Vec_PtrFree( vOrder );
}